

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.h
# Opt level: O3

void __thiscall vpl::Scope::CheckArgCnt(Scope *this,size_t arg_cnt)

{
  Function *pFVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  stringstream ss;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  pFVar1 = this->cur_func_ptr_;
  if (pFVar1 == (Function *)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Function is not prepared!");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((long)(pFVar1->args_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(pFVar1->args_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5 == arg_cnt) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"Wrong number of arguments: expected ",0x24);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", got ",6);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar3,asStack_1c8);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CheckArgCnt(size_t arg_cnt) {
        if (cur_func_ptr_ == nullptr) {
            throw std::runtime_error("Function is not prepared!");
        }
        if (arg_cnt != cur_func_ptr_->GetArgs().size()) {
            std::stringstream ss;
            ss << "Wrong number of arguments: expected " << cur_func_ptr_->GetArgs().size() << ", got " << arg_cnt;
            throw std::runtime_error(ss.str());
        }
    }